

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  pointer puVar1;
  DescriptorPool *pDVar2;
  vector *pvVar3;
  FieldDescriptor *this_00;
  FileDescriptor *pFVar4;
  pointer ppFVar5;
  size_type sVar6;
  bool bVar7;
  char cVar8;
  undefined8 *puVar9;
  ServiceDescriptor *this_01;
  mapped_type pDVar10;
  mapped_type *ppDVar11;
  Descriptor *pDVar12;
  Message *this_02;
  Printer *pPVar13;
  reference ppVar14;
  char *pcVar15;
  Message *extraout_RDX;
  long lVar16;
  int i;
  int iVar17;
  pointer puVar18;
  Options *pOVar19;
  Options *in_R9;
  int j;
  int iVar20;
  int i_1;
  _Alloc_hider _Var21;
  string_view name;
  string_view name_00;
  initializer_list<const_google::protobuf::Message_*> __l;
  iterator iVar22;
  Printer *p_local;
  allocator<char> local_94a;
  allocator<char> local_949;
  Options *local_948;
  allocator<char> local_93d;
  allocator<char> local_93c;
  allocator<char> local_93b;
  allocator<char> local_93a;
  allocator<char> local_939;
  FileDescriptor *local_938;
  Message *local_930;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t num_deps;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  res;
  string local_8c8;
  string local_8a8;
  char *local_888;
  size_type local_880;
  char local_878 [8];
  undefined8 uStack_870;
  char *local_868;
  size_type local_860;
  char local_858 [8];
  undefined8 uStack_850;
  pointer local_848;
  pointer local_840;
  undefined1 local_838;
  undefined7 uStack_837;
  char *local_828;
  size_type local_820;
  char local_818 [8];
  undefined8 uStack_810;
  pointer local_808;
  pointer local_800;
  undefined1 local_7f8;
  undefined7 uStack_7f7;
  DynamicMessageFactory factory;
  _Alloc_hider _Stack_7e0;
  CrossFileReferences refs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  string desc_name;
  string file_data;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  variant<std::__cxx11::string,std::function<bool()>> local_548 [32];
  __index_type local_528;
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  bool local_500;
  bool local_4b8;
  undefined1 local_4b0 [64];
  __index_type local_470;
  _Alloc_hider local_468;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  bool local_448;
  bool local_400;
  Sub local_3f8;
  Sub local_340;
  Sub local_288;
  Sub local_1d0;
  FileDescriptorProto file_proto;
  undefined4 uStack_114;
  
  p_local = p;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Emit(p,0x6d,
                      "\n      static constexpr const ::_pb::EnumDescriptor**\n          $file_level_enum_descriptors$ = nullptr;\n    "
                     );
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"len",(allocator<char> *)&refs);
    _file_proto = (long)(this->enum_generators_).
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->enum_generators_).
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
    io::Printer::Sub::Sub<unsigned_long>((Sub *)&to_process,&local_588,(unsigned_long *)&file_proto)
    ;
    google::protobuf::io::Printer::Emit
              (p,&to_process,1,0x55,
               "\n      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];\n    "
              );
    io::Printer::Sub::~Sub((Sub *)&to_process);
    std::__cxx11::string::~string((string *)&local_588);
  }
  local_948 = &this->options_;
  bVar7 = HasGenericServices(this->file_,local_948);
  pPVar13 = p_local;
  if ((bVar7) && (0 < *(int *)(this->file_ + 0x44))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a8,"len",(allocator<char> *)&refs);
    _file_proto = *(undefined4 *)(this->file_ + 0x44);
    io::Printer::Sub::Sub<int>((Sub *)&to_process,&local_5a8,(int *)&file_proto);
    google::protobuf::io::Printer::Emit
              (pPVar13,&to_process,1,0x65,
               "\n      static const ::_pb::ServiceDescriptor*\n          $file_level_service_descriptors$[$len$];\n    "
              );
    io::Printer::Sub::~Sub((Sub *)&to_process);
    std::__cxx11::string::~string((string *)&local_5a8);
  }
  else {
    io::Printer::Emit(p_local,0x73,
                      "\n      static constexpr const ::_pb::ServiceDescriptor**\n          $file_level_service_descriptors$ = nullptr;\n    "
                     );
  }
  puVar18 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar18 == puVar1) {
    io::Printer::Emit(p_local,0xcd,
                      "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;\n      static constexpr ::_pb::Message* const* file_default_instances = nullptr;\n    "
                     );
  }
  else {
    refs.weak_default_instances.
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.size_ = 0;
    refs.weak_default_instances.
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.root_ = (node_type *)0x0;
    refs.weak_default_instances.
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.rightmost_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
    .
    super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
    .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              )(Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
                )0x0;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&refs,(long)puVar1 - (long)puVar18 >> 3);
    pPVar13 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_808,"offsets",(allocator<char> *)&factory);
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&to_process.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_808 != (pointer)&local_7f8) {
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = local_808;
    }
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_7f7,local_7f8);
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_800;
    local_800 = (pointer)0x0;
    local_7f8 = 0;
    _file_proto = (void *)0x0;
    local_808 = (pointer)&local_7f8;
    _file_proto = operator_new(0x20);
    *(FileGenerator **)_file_proto = this;
    *(CrossFileReferences **)(_file_proto + 8) = &refs;
    *(Printer ***)(_file_proto + 0x10) = &p_local;
    *(code *)(_file_proto + 0x18) = (code)0x0;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_548,(function<bool_()> *)&file_proto);
    std::_Function_base::~_Function_base((_Function_base *)&file_proto);
    local_518 = 0;
    local_510._M_local_buf[0] = '\0';
    local_500 = false;
    local_520._M_p = (pointer)&local_510;
    if (local_528 == '\x01') {
      std::__cxx11::string::assign((char *)&local_520);
    }
    local_4b8 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"schemas",(allocator<char> *)&fields);
    local_4b0._0_8_ = local_4b0 + 0x10;
    if (local_828 == local_818) {
      local_4b0._24_8_ = uStack_810;
    }
    else {
      local_4b0._0_8_ = local_828;
    }
    local_4b0._8_8_ = local_820;
    local_820 = 0;
    local_818[0] = '\0';
    _file_proto = (void *)0x0;
    local_828 = local_818;
    _file_proto = operator_new(0x20);
    *(FileGenerator **)_file_proto = this;
    *(Printer ***)(_file_proto + 8) = &p_local;
    *(CrossFileReferences **)(_file_proto + 0x10) = &refs;
    *(code *)(_file_proto + 0x18) = (code)0x0;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_4b0 + 0x20),
               (function<bool_()> *)&file_proto);
    std::_Function_base::~_Function_base((_Function_base *)&file_proto);
    local_468._M_p = (pointer)&local_458;
    local_460 = 0;
    local_458._M_local_buf[0] = '\0';
    local_448 = false;
    if (local_470 == '\x01') {
      std::__cxx11::string::assign((char *)&local_468);
    }
    local_400 = false;
    google::protobuf::io::Printer::Emit
              (pPVar13,&to_process,2,0x160,
               "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
              );
    lVar16 = 0xb8;
    do {
      io::Printer::Sub::~Sub
                ((Sub *)((long)&to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar16));
      lVar16 = lVar16 + -0xb8;
    } while (lVar16 != -0xb8);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_808);
    bVar7 = UsingImplicitWeakDescriptor(this->file_,local_948);
    pPVar13 = p_local;
    if (!bVar7) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_848,"defaults",(allocator<char> *)&factory);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&to_process.
                     super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_848 != (pointer)&local_838) {
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = local_848;
      }
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_837,local_838);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_840;
      local_840 = (pointer)0x0;
      local_838 = 0;
      _file_proto = (void *)0x0;
      local_848 = (pointer)&local_838;
      _file_proto = operator_new(0x18);
      *(FileGenerator **)_file_proto = this;
      *(Printer ***)(_file_proto + 8) = &p_local;
      *(code *)(_file_proto + 0x10) = (code)0x0;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_548,(function<bool_()> *)&file_proto);
      std::_Function_base::~_Function_base((_Function_base *)&file_proto);
      local_518 = 0;
      local_510._M_local_buf[0] = '\0';
      local_500 = false;
      local_520._M_p = (pointer)&local_510;
      if (local_528 == '\x01') {
        std::__cxx11::string::assign((char *)&local_520);
      }
      local_4b8 = false;
      google::protobuf::io::Printer::Emit
                (pPVar13,&to_process,1,0x92,
                 "\n                static const ::_pb::Message* const file_default_instances[] = {\n                    $defaults$,\n                };\n              "
                );
      io::Printer::Sub::~Sub((Sub *)&to_process);
      std::__cxx11::string::~string((string *)&local_848);
    }
    std::
    _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&refs);
  }
  StripSourceRetentionOptions((compiler *)&file_proto,this->file_,false);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  google::protobuf::MessageLite::SerializeToString((string *)&file_proto);
  name._M_str = (char *)this->file_;
  name._M_len = (size_t)"descriptor_table_protodef";
  UniqueName_abi_cxx11_(&desc_name,(cpp *)0x19,name,(FileDescriptor *)local_948,in_R9);
  pPVar13 = p_local;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"desc_name",(allocator<char> *)&factory);
  io::Printer::Sub::Sub<std::__cxx11::string&>((Sub *)&to_process,&local_5c8,&desc_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"encoded_file_proto",(allocator<char> *)&fields);
  local_4b0._0_8_ = local_4b0 + 0x10;
  if (local_868 == local_858) {
    local_4b0._24_8_ = uStack_850;
  }
  else {
    local_4b0._0_8_ = local_868;
  }
  local_4b0._8_8_ = local_860;
  local_860 = 0;
  local_858[0] = '\0';
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)0x0;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)0x0;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )(Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
              )0x0;
  local_868 = local_858;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)operator_new(0x20);
  *(FileGenerator **)
   refs.weak_default_instances.
   super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
   .
   super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
   .tree_.root_ = this;
  *(Printer ***)
   (refs.weak_default_instances.
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.root_ + 8) = &p_local;
  *(string **)
   (refs.weak_default_instances.
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.root_ + 0x10) = &file_data;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_[0x18] = (node_type)0x0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_4b0 + 0x20),
             (function<bool_()> *)&refs);
  std::_Function_base::~_Function_base((_Function_base *)&refs);
  local_460 = 0;
  local_458._M_local_buf[0] = '\0';
  local_448 = false;
  local_468._M_p = (pointer)&local_458;
  if (local_470 == '\x01') {
    std::__cxx11::string::assign((char *)&local_468);
  }
  local_400 = false;
  google::protobuf::io::Printer::Emit
            (pPVar13,&to_process,2,0x96,
             "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
            );
  lVar16 = 0xb8;
  do {
    io::Printer::Sub::~Sub
              ((Sub *)((long)&to_process.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar16));
    lVar16 = lVar16 + -0xb8;
  } while (lVar16 != -0xb8);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_5c8);
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  GetCrossFileReferencesForFile(this,this->file_,&refs);
  pPVar13 = p_local;
  num_deps = refs.weak_reflection_files.
             super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .
             super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .tree_.size_ +
             refs.strong_reflection_files.
             super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .
             super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .tree_.size_;
  if (num_deps != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e8,"len",(allocator<char> *)&fields);
    io::Printer::Sub::Sub<unsigned_long&>((Sub *)&to_process,&local_5e8,&num_deps);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_888,"deps",(allocator<char> *)&res);
    local_4b0._0_8_ = local_4b0 + 0x10;
    if (local_888 == local_878) {
      local_4b0._24_8_ = uStack_870;
    }
    else {
      local_4b0._0_8_ = local_888;
    }
    local_4b0._8_8_ = local_880;
    local_880 = 0;
    local_878[0] = '\0';
    _factory = (_Any_data)ZEXT816(0);
    local_888 = local_878;
    puVar9 = (undefined8 *)operator_new(0x20);
    *puVar9 = &refs;
    puVar9[1] = &p_local;
    puVar9[2] = this;
    *(undefined1 *)(puVar9 + 3) = 0;
    _factory = puVar9;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_4b0 + 0x20),
               (function<bool_()> *)&factory);
    std::_Function_base::~_Function_base((_Function_base *)&factory);
    local_460 = 0;
    local_458._M_local_buf[0] = '\0';
    local_448 = false;
    local_468._M_p = (pointer)&local_458;
    if (local_470 == '\x01') {
      std::__cxx11::string::assign((char *)&local_468);
    }
    local_400 = false;
    google::protobuf::io::Printer::Emit
              (pPVar13,&to_process,2,0x91,
               "\n          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =\n              {\n                  $deps$,\n          };\n        "
              );
    lVar16 = 0xb8;
    do {
      io::Printer::Sub::~Sub
                ((Sub *)((long)&to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar16));
      lVar16 = lVar16 + -0xb8;
    } while (lVar16 != -0xb8);
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::~string((string *)&local_5e8);
  }
  pPVar13 = p_local;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"eager",&local_949);
  local_8c8._M_dataplus._M_p = "false";
  io::Printer::Sub::Sub<char_const*>((Sub *)&to_process,&local_608,(char **)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"file_proto_len",&local_94a);
  local_8a8._M_dataplus._M_p = (pointer)file_data._M_string_length;
  if ((this->options_).strip_nonfunctional_codegen != false) {
    local_8a8._M_dataplus._M_p = (pointer)0x0;
  }
  io::Printer::Sub::Sub<unsigned_long>((Sub *)local_4b0,&local_628,(unsigned_long *)&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"proto_name",&local_939);
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_3f8,&local_648,&desc_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"deps_ptr",&local_93a);
  if (num_deps == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&res,"nullptr",&local_93b);
  }
  else {
    _factory = (_Any_data)google::protobuf::io::Printer::LookupVar(p_local,10,"desc_table");
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._0_16_ = absl::lts_20240722::NullSafeStringView("_deps");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&res,(AlphaNum *)&factory);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_340,&local_668,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"num_deps",&local_93c);
  io::Printer::Sub::Sub<unsigned_long&>(&local_288,&local_688,&num_deps);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"num_msgs",&local_93d);
  local_748._M_dataplus._M_p =
       (pointer)((long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  io::Printer::Sub::Sub<unsigned_long>(&local_1d0,&local_6a8,(unsigned_long *)&local_748);
  google::protobuf::io::Printer::Emit
            (pPVar13,&to_process,6,0x226,
             "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
            );
  lVar16 = 0x398;
  do {
    io::Printer::Sub::~Sub
              ((Sub *)((long)&to_process.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar16));
    lVar16 = lVar16 + -0xb8;
  } while (lVar16 != -0xb8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  cVar8 = google::protobuf::internal::cpp::IsLazilyInitializedFile
                    ((*(undefined8 **)(this->file_ + 8))[1],**(undefined8 **)(this->file_ + 8));
  if (cVar8 == '\0') {
    bVar7 = UsingImplicitWeakDescriptor(this->file_,local_948);
    if (bVar7) {
      local_938 = this->file_;
      res.
      super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .tree_.root_ = (node_type *)
                     absl::lts_20240722::container_internal::
                     btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
                     ::EmptyNode()::empty_node;
      res.
      super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .tree_.rightmost_.
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      .
      super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*,_2UL,_false>
      .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                )absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
                 ::EmptyNode()::empty_node;
      res.
      super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .tree_.size_ = 0;
      for (iVar17 = 0; pFVar4 = local_938, iVar17 < *(int *)(local_938 + 0x44); iVar17 = iVar17 + 1)
      {
        this_01 = FileDescriptor::service(local_938,iVar17);
        for (iVar20 = 0; iVar20 < *(int *)(this_01 + 0x38); iVar20 = iVar20 + 1) {
          ServiceDescriptor::method(this_01,iVar20);
          pDVar10 = (mapped_type)google::protobuf::MethodDescriptor::input_type();
          lVar16 = google::protobuf::MethodDescriptor::input_type();
          ppDVar11 = absl::lts_20240722::container_internal::
                     btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                     ::operator[]<std::__cxx11::string>
                               ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                 *)&res,(key_arg<std::__cxx11::basic_string<char>_> *)
                                        (*(long *)(lVar16 + 8) + 0x20));
          *ppDVar11 = pDVar10;
          pDVar10 = (mapped_type)google::protobuf::MethodDescriptor::output_type();
          lVar16 = google::protobuf::MethodDescriptor::output_type();
          ppDVar11 = absl::lts_20240722::container_internal::
                     btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                     ::operator[]<std::__cxx11::string>
                               ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                 *)&res,(key_arg<std::__cxx11::basic_string<char>_> *)
                                        (*(long *)(lVar16 + 8) + 0x20));
          *ppDVar11 = pDVar10;
        }
      }
      pDVar2 = *(DescriptorPool **)(local_938 + 0x18);
      pDVar12 = FileDescriptorProto::GetDescriptor();
      lVar16 = google::protobuf::DescriptorPool::FindMessageTypeByName
                         (pDVar2,*(undefined8 *)(*(long *)(pDVar12 + 8) + 0x28),
                          *(undefined8 *)(*(long *)(pDVar12 + 8) + 0x20));
      if (lVar16 != 0) {
        google::protobuf::DynamicMessageFactory::DynamicMessageFactory(&factory,pDVar2);
        this_02 = (Message *)
                  google::protobuf::DynamicMessageFactory::GetPrototype((Descriptor *)&factory);
        local_930 = Message::New(this_02);
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&to_process);
        google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)pFVar4);
        google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
        cVar8 = google::protobuf::MessageLite::ParseFromString
                          (local_930,
                           fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (cVar8 == '\0') {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_8a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/file.cc"
                     ,0x42e,0x40,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())")
          ;
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_8a8);
        }
        std::__cxx11::string::~string((string *)&fields);
        google::protobuf::FileDescriptorProto::~FileDescriptorProto
                  ((FileDescriptorProto *)&to_process);
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_930;
        __l._M_len = 1;
        __l._M_array = (iterator)&fields;
        std::
        vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::vector(&to_process,__l,(allocator_type *)&local_8a8);
        while (to_process.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               to_process.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar3 = (vector *)
                   to_process.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          to_process.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               to_process.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          google::protobuf::Message::GetMetadata();
          google::protobuf::Reflection::ListFields(extraout_RDX,pvVar3);
          ppFVar5 = fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pPVar13 = (Printer *)
                    fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while (pPVar13 != (Printer *)ppFVar5) {
            this_00 = *(FieldDescriptor **)pPVar13;
            local_938 = (FileDescriptor *)pPVar13;
            if (((byte)this_00[1] & 8) != 0) {
              pDVar10 = (mapped_type)google::protobuf::Message::GetMetadata();
              ppDVar11 = absl::lts_20240722::container_internal::
                         btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                         ::operator[]<std::__cxx11::string>
                                   ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                     *)&res,(key_arg<std::__cxx11::basic_string<char>_> *)
                                            (*(long *)(pDVar10 + 8) + 0x20));
              *ppDVar11 = pDVar10;
            }
            pDVar10 = (mapped_type)google::protobuf::FieldDescriptor::message_type();
            if (pDVar10 != (mapped_type)0x0) {
              if (((byte)this_00[1] & 8) != 0) {
                ppDVar11 = absl::lts_20240722::container_internal::
                           btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                           ::operator[]<std::__cxx11::string>
                                     ((btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                       *)&res,(key_arg<std::__cxx11::basic_string<char>_> *)
                                              (*(long *)(pDVar10 + 8) + 0x20));
                *ppDVar11 = pDVar10;
              }
              bVar7 = FieldDescriptor::is_repeated(this_00);
              if (bVar7) {
                for (iVar17 = 0;
                    iVar20 = google::protobuf::Reflection::FieldSize
                                       (extraout_RDX,(FieldDescriptor *)pvVar3), iVar17 < iVar20;
                    iVar17 = iVar17 + 1) {
                  local_8a8._M_dataplus._M_p =
                       (pointer)google::protobuf::Reflection::GetRepeatedMessage
                                          (extraout_RDX,(FieldDescriptor *)pvVar3,(int)this_00);
                  std::
                  vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  ::emplace_back<google::protobuf::Message_const*>
                            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                              *)&to_process,(Message **)&local_8a8);
                }
              }
              else {
                local_8a8._M_dataplus._M_p =
                     (pointer)google::protobuf::Reflection::GetMessage
                                        (extraout_RDX,(FieldDescriptor *)pvVar3,
                                         (MessageFactory *)this_00);
                std::
                vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                ::emplace_back<google::protobuf::Message_const*>
                          ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                            *)&to_process,(Message **)&local_8a8);
              }
            }
            pPVar13 = (Printer *)(local_938 + 8);
          }
          std::
          _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::~_Vector_base(&fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
        }
        std::
        _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::~_Vector_base(&to_process.
                         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       );
        (**(code **)(*(long *)local_930 + 8))();
        google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(&factory);
      }
      local_8c8._M_dataplus._M_p = (char *)0x0;
      local_8c8._M_string_length = 0;
      local_8c8.field_2._M_allocated_capacity = 0;
      iVar22 = absl::lts_20240722::container_internal::
               btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::begin((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                        *)&res);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar22.node_;
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(to_process.
                             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar22.position_);
      iVar22 = absl::lts_20240722::container_internal::
               btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::end((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                      *)&res);
      _factory = iVar22._0_12_;
      while (bVar7 = absl::lts_20240722::container_internal::
                     btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     ::operator!=((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                                   *)&to_process,(iterator *)&factory), bVar7) {
        ppVar14 = absl::lts_20240722::container_internal::
                  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                               *)&to_process);
        bVar7 = IsBootstrapProto(local_948,*(FileDescriptor **)(ppVar14->second + 0x10));
        if (!bVar7) {
          std::
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)&local_8c8,&ppVar14->second);
        }
        absl::lts_20240722::container_internal::
        btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     *)&to_process);
      }
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)&res);
      sVar6 = local_8c8._M_string_length;
      for (_Var21._M_p = local_8c8._M_dataplus._M_p; _Var21._M_p != (pointer)sVar6;
          _Var21._M_p = _Var21._M_p + 8) {
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)_Var21._M_p;
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)absl::lts_20240722::internal_any_invocable::LocalManagerTrivial;
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
        std::
        vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
        ::emplace_back<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>
                  ((vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                    *)(this->static_initializers_ + 1),
                   (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process);
        (*(code *)to_process.
                  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  (1,(AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process,
                   (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process);
      }
      std::
      _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)&local_8c8);
    }
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)absl::lts_20240722::internal_any_invocable::LocalManagerTrivial;
    std::
    vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
    ::emplace_back<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>
              ((vector<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                *)(this->static_initializers_ + 1),
               (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process);
    (*(code *)to_process.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(1,&to_process);
  }
  bVar7 = IsFileDescriptorProto(this->file_,local_948);
  if (bVar7) {
    res.
    super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .tree_.root_ = (node_type *)p_local;
    res.
    super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .tree_.size_ = 0;
    bVar7 = (this->options_).opensource_runtime != false;
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    if (bVar7) {
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x10;
    }
    pcVar15 = "proto2";
    if (bVar7) {
      pcVar15 = "google::protobuf";
    }
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar15;
    _factory = (_Any_data)absl::lts_20240722::NullSafeStringView("::internal");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&fields,(AlphaNum *)&to_process);
    NamespaceOpener::ChangeTo
              ((NamespaceOpener *)&res,
               fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&fields);
    local_938 = (FileDescriptor *)p_local;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"dummy",&local_949);
    name_00._M_str = (char *)this->file_;
    name_00._M_len = (size_t)"dynamic_init_dummy";
    pOVar19 = local_948;
    UniqueName_abi_cxx11_(&local_8a8,(cpp *)0x12,name_00,(FileDescriptor *)local_948,in_R9);
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)&to_process,&local_6c8,&local_8a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,"initializers",&local_94a);
    puVar18 = (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
    local_748._M_string_length = 0;
    local_748.field_2._M_local_buf[0] = '\0';
    pcVar15 = "";
    for (; puVar18 != puVar1; puVar18 = puVar18 + 1) {
      std::__cxx11::string::append((char *)&local_748,(ulong)pcVar15);
      DefaultInstanceName_abi_cxx11_
                (&local_8c8,
                 (cpp *)((puVar18->_M_t).
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                        ._M_head_impl)->descriptor_,(Descriptor *)local_948,(Options *)0x0,
                 SUB81(pOVar19,0));
      _Stack_7e0._M_p = local_8c8._M_dataplus._M_p;
      _factory = local_8c8._M_string_length;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._0_16_ = absl::lts_20240722::NullSafeStringView(".Init();");
      absl::lts_20240722::StrAppend((string *)&local_748,(AlphaNum *)&factory,(AlphaNum *)&fields);
      std::__cxx11::string::~string((string *)&local_8c8);
      pcVar15 = "\n";
    }
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_4b0,&local_6e8,&local_748);
    google::protobuf::io::Printer::Emit
              (local_938,&to_process,2,0x1dc,
               "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
              );
    lVar16 = 0xb8;
    do {
      io::Printer::Sub::~Sub
                ((Sub *)((long)&to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar16));
      lVar16 = lVar16 + -0xb8;
    } while (lVar16 != -0xb8);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_6c8);
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)&res);
  }
  CrossFileReferences::~CrossFileReferences(&refs);
  std::__cxx11::string::~string((string *)&desc_name);
  std::__cxx11::string::~string((string *)&file_data);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor**
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      static const ::_pb::ServiceDescriptor*
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor**
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<std::pair<size_t, size_t>> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset,
                                                        offsets[i].second);
                 offset += offsets[i].first;
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      p->Emit({{"defaults",
                [&] {
                  for (auto& gen : message_generators_) {
                    p->Emit(
                        {
                            {"ns", Namespace(gen->descriptor(), options_)},
                            {"class", ClassName(gen->descriptor())},
                        },
                        R"cc(
                          &$ns$::_$class$_default_instance_._instance,
                        )cc");
                  }
                }}},
              R"cc(
                static const ::_pb::Message* const file_default_instances[] = {
                    $defaults$,
                };
              )cc");
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;
      static constexpr ::_pb::Message* const* file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =
              {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}